

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O2

void __thiscall IGameController::EvaluateSpawnType(IGameController *this,CSpawnEval *pEval,int Type)

{
  vec2 *pvVar1;
  long lVar2;
  CCharacter *pCVar3;
  vec2 Pos;
  vec2 Pos_00;
  vec2 vVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int c;
  ulong uVar10;
  long in_FS_OFFSET;
  float fVar11;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar12;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar13;
  float fVar14;
  float fVar15;
  undefined8 local_268 [6];
  CCharacter *aEnts [64];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = 0;
  do {
    if (this->m_aNumSpawnPoints[Type] <= lVar8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    pvVar1 = this->m_aaSpawnPoints[Type] + lVar8;
    uVar6 = CGameWorld::FindEntities
                      (&this->m_pGameServer->m_World,*pvVar1,64.0,(CEntity **)aEnts,0x40,3);
    local_268[0] = 0;
    local_268[1] = 0xc2000000;
    local_268[2] = 0xc200000000000000;
    local_268[3] = 0x42000000;
    local_268[4] = 0x4200000000000000;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    uVar9 = 0;
    uVar10 = 0xffffffffffffffff;
    while ((iVar7 = (int)uVar10, uVar9 < 5 && (iVar7 == -1))) {
      uVar10 = 0;
      do {
        if (uVar6 == uVar10) {
          uVar10 = uVar9 & 0xffffffff;
          goto LAB_0011afb4;
        }
        fVar11 = (float)local_268[uVar9];
        fVar14 = (float)((ulong)local_268[uVar9] >> 0x20);
        Pos_00.field_1.y = (*pvVar1).field_1.y + fVar14;
        Pos_00.field_0.x = (*pvVar1).field_0.x + fVar11;
        bVar5 = CCollision::CheckPoint(&this->m_pGameServer->m_Collision,Pos_00,1);
        if (bVar5) break;
        pCVar3 = aEnts[uVar10];
        fVar15 = (pCVar3->super_CEntity).m_Pos.field_0.x - ((pvVar1->field_0).x + fVar11);
        fVar11 = (pCVar3->super_CEntity).m_Pos.field_1.y - (fVar14 + (pvVar1->field_1).y);
        uVar10 = uVar10 + 1;
      } while ((pCVar3->super_CEntity).m_ProximityRadius < SQRT(fVar15 * fVar15 + fVar11 * fVar11));
      uVar10 = 0xffffffffffffffff;
LAB_0011afb4:
      uVar9 = uVar9 + 1;
    }
    if (iVar7 != -1) {
      aVar12.x = (float)local_268[iVar7] + (*pvVar1).field_0.x;
      aVar13.y = (float)((ulong)local_268[iVar7] >> 0x20) + (*pvVar1).field_1.y;
      vVar4.field_1.y = aVar13.y;
      vVar4.field_0.x = aVar12.x;
      if (pEval->m_RandomSpawn == true) {
        fVar11 = random_float();
        fVar11 = fVar11 + (float)iVar7;
      }
      else {
        Pos.field_1.y = aVar13.y;
        Pos.field_0.x = aVar12.x;
        fVar11 = EvaluateSpawnPos(this,pEval,Pos);
      }
      if ((pEval->m_Got != true) || (fVar11 < pEval->m_Score)) {
        pEval->m_Got = true;
        pEval->m_Score = fVar11;
        pEval->m_Pos = vVar4;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void IGameController::EvaluateSpawnType(CSpawnEval *pEval, int Type) const
{
	// get spawn point
	for(int i = 0; i < m_aNumSpawnPoints[Type]; i++)
	{
		// check if the position is occupado
		CCharacter *aEnts[MAX_CLIENTS];
		int Num = GameServer()->m_World.FindEntities(m_aaSpawnPoints[Type][i], 64, (CEntity**)aEnts, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
		vec2 Positions[5] = { vec2(0.0f, 0.0f), vec2(-32.0f, 0.0f), vec2(0.0f, -32.0f), vec2(32.0f, 0.0f), vec2(0.0f, 32.0f) };	// start, left, up, right, down
		int Result = -1;
		for(int Index = 0; Index < 5 && Result == -1; ++Index)
		{
			Result = Index;
			for(int c = 0; c < Num; ++c)
				if(GameServer()->Collision()->CheckPoint(m_aaSpawnPoints[Type][i]+Positions[Index]) ||
					distance(aEnts[c]->GetPos(), m_aaSpawnPoints[Type][i]+Positions[Index]) <= aEnts[c]->GetProximityRadius())
				{
					Result = -1;
					break;
				}
		}
		if(Result == -1)
			continue;	// try next spawn point

		vec2 P = m_aaSpawnPoints[Type][i]+Positions[Result];
		float S = pEval->m_RandomSpawn ? (Result + random_float()) : EvaluateSpawnPos(pEval, P);
		if(!pEval->m_Got || pEval->m_Score > S)
		{
			pEval->m_Got = true;
			pEval->m_Score = S;
			pEval->m_Pos = P;
		}
	}
}